

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O1

void __thiscall
rr::FragmentProcessor::render
          (FragmentProcessor *this,MultisamplePixelBufferAccess *msColorBuffer,
          MultisamplePixelBufferAccess *msDepthBuffer,MultisamplePixelBufferAccess *msStencilBuffer,
          Fragment *inputFragments,int numFragments,FaceType fragmentFacing,
          FragmentOperationState *state)

{
  GenericVec4 *pGVar1;
  bool bVar2;
  int numSamplesPerFragment;
  uint uVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  Fragment *pFVar7;
  StencilState *stencilState;
  ConstPixelBufferAccess *stencilBuffer;
  BlendState *blendAState;
  BlendState *blendRGBState;
  Vec4 *blendColor;
  int i;
  int iVar8;
  int iVar9;
  undefined8 in_RAX;
  undefined7 extraout_var;
  long lVar10;
  Vec3 *pVVar11;
  undefined1 uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  int *piVar17;
  uint *puVar18;
  SampleData *pSVar19;
  long lVar20;
  int regSampleNdx_2;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  bool bVar24;
  ChannelOrder CVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  Vector<float,_4> res;
  Vec4 dstColor;
  Vec4 srcColor;
  Vec4 maxClampValue;
  Vec4 colorMaskNegationFactor;
  Vec4 colorMaskFactor;
  Fragment *local_170;
  TextureFormat local_168;
  undefined8 uStack_160;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  uint local_14c;
  undefined1 local_148 [32];
  undefined1 local_128 [32];
  TextureFormat local_108;
  undefined8 uStack_100;
  TextureFormat local_f8;
  undefined8 uStack_f0;
  ulong local_e8;
  BVec4 *local_e0;
  TextureChannelClass local_d4;
  ulong local_d0;
  uint local_c4;
  ConstPixelBufferAccess *local_c0;
  StencilState *local_b8;
  ConstPixelBufferAccess *local_b0;
  Vec4 local_a8;
  Vec4 local_98;
  BlendState *local_88;
  BlendState *local_80;
  Vec4 *local_78;
  Vec3 *local_70;
  int *local_68;
  uint *local_60;
  WindowRectangle *local_58;
  Fragment *local_50;
  TextureFormat local_48;
  int aiStack_40 [4];
  
  local_154 = 0;
  if ((0 < (msDepthBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[0]) &&
     (0 < (msDepthBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[1])) {
    in_RAX = CONCAT71((int7)((ulong)in_RAX >> 8),
                      0 < (msDepthBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[2]);
    local_154 = (undefined4)in_RAX;
  }
  local_158 = 0;
  if ((0 < (msStencilBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[0]) &&
     (0 < (msStencilBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[1])) {
    local_158 = (undefined4)
                CONCAT71((int7)((ulong)in_RAX >> 8),
                         0 < (msStencilBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data
                             [2]);
  }
  bVar24 = state->stencilTestEnabled;
  bVar2 = state->depthTestEnabled;
  local_170 = inputFragments;
  local_c0 = (ConstPixelBufferAccess *)msDepthBuffer;
  local_b0 = (ConstPixelBufferAccess *)msStencilBuffer;
  local_d4 = tcu::getTextureChannelClass
                       ((msColorBuffer->m_access).super_ConstPixelBufferAccess.m_format.type);
  local_c4 = (uint)(local_d4 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER);
  if (local_d4 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    local_c4 = 2;
  }
  local_148._24_8_ = msColorBuffer;
  numSamplesPerFragment = (msColorBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[0];
  local_128._28_4_ = numFragments;
  iVar8 = numSamplesPerFragment * numFragments + -1;
  iVar16 = numSamplesPerFragment * numFragments + 0x3e;
  if (-1 < iVar8) {
    iVar16 = iVar8;
  }
  fVar27 = 1.0;
  local_a8.m_data[3] = 0.0;
  local_98.m_data[0] = 1.0;
  local_a8.m_data[0] = 0.0;
  if ((state->colorMask).m_data[0] == false) {
    local_98.m_data[0] = 0.0;
    local_a8.m_data[0] = fVar27;
  }
  local_98.m_data[1] = 1.0;
  local_a8.m_data[1] = 0.0;
  if ((state->colorMask).m_data[1] == false) {
    local_98.m_data[1] = 0.0;
    local_a8.m_data[1] = fVar27;
  }
  local_a8.m_data[2] = 0.0;
  local_98.m_data[2] = fVar27;
  if ((state->colorMask).m_data[2] == false) {
    local_98.m_data[2] = 0.0;
    local_a8.m_data[2] = fVar27;
  }
  local_154 = CONCAT31((int3)((uint)local_154 >> 8),(byte)local_154 & bVar2);
  local_158 = CONCAT31((int3)((uint)local_158 >> 8),(byte)local_158 & bVar24);
  local_d0 = (ulong)(uint)(iVar16 >> 6);
  local_e0 = &state->colorMask;
  bVar24 = (state->colorMask).m_data[3] == false;
  local_98.m_data[3] = 1.0;
  if (bVar24) {
    local_98.m_data[3] = 0.0;
  }
  if (bVar24) {
    local_a8.m_data[3] = 1.0;
  }
  if (state->sRGBEnabled == true) {
    bVar24 = tcu::isSRGB((msColorBuffer->m_access).super_ConstPixelBufferAccess.m_format);
    local_150 = (undefined4)CONCAT71(extraout_var,bVar24);
  }
  else {
    local_150 = 0;
  }
  if (-0x40 < iVar8) {
    local_b8 = state->stencilStates + fragmentFacing;
    local_58 = &state->scissorRectangle;
    local_78 = &state->blendColor;
    local_80 = &state->blendRGBState;
    local_88 = &state->blendAState;
    local_60 = this->m_sampleRegister[0].unsignedValue.m_data + 3;
    local_68 = this->m_sampleRegister[0].signedValue.m_data + 3;
    local_70 = &this->m_sampleRegister[0].blendedRGB;
    uVar21 = 0;
    iVar8 = local_128._28_4_;
    do {
      uVar14 = (long)((int)uVar21 << 6) / (long)numSamplesPerFragment;
      uVar13 = 0;
      uVar23 = uVar14 & 0xffffffff;
      pSVar19 = this->m_sampleRegister;
      do {
        uVar15 = (int)uVar13 >> 0x1f;
        uVar22 = (uint)uVar14;
        iVar16 = (int)((long)((ulong)uVar15 << 0x20 | uVar13 & 0xffffffff) /
                      (long)numSamplesPerFragment) + uVar22;
        if (iVar16 < iVar8) {
          ((SampleData *)&pSVar19->isAlive)->isAlive =
               (local_170[iVar16].coverage >>
                ((uint)((long)((ulong)uVar15 << 0x20 | uVar13 & 0xffffffff) %
                       (long)numSamplesPerFragment) & 0x1f) & 1) != 0;
          pSVar19->depthPassed = true;
        }
        else {
          ((SampleData *)&pSVar19->isAlive)->isAlive = false;
        }
        uVar13 = uVar13 + 1;
        pSVar19 = pSVar19 + 1;
      } while (uVar13 != 0x40);
      if (state->scissorTestEnabled != false) {
        executeScissorTest(this,uVar22,numSamplesPerFragment,local_170,local_58);
      }
      stencilBuffer = local_b0;
      stencilState = local_b8;
      pFVar7 = local_170;
      local_14c = uVar22;
      if ((char)local_158 != '\0') {
        local_e8 = uVar21;
        executeStencilCompare
                  (this,uVar22,numSamplesPerFragment,local_170,local_b8,state->numStencilBits,
                   local_b0);
        uVar21 = local_e8;
        uVar23 = (ulong)local_14c;
        executeStencilSFail(this,local_14c,numSamplesPerFragment,pFVar7,stencilState,
                            state->numStencilBits,(PixelBufferAccess *)stencilBuffer);
      }
      iVar16 = (int)uVar23;
      if (((char)local_154 != '\0') &&
         (executeDepthCompare(this,iVar16,numSamplesPerFragment,local_170,state->depthFunc,local_c0)
         , state->depthMask == true)) {
        executeDepthWrite(this,iVar16,numSamplesPerFragment,local_170,(PixelBufferAccess *)local_c0)
        ;
      }
      if ((char)local_158 != '\0') {
        executeStencilDpFailAndPass
                  (this,iVar16,numSamplesPerFragment,local_170,local_b8,state->numStencilBits,
                   (PixelBufferAccess *)local_b0);
      }
      if ((char)local_154 != '\0') {
        lVar10 = 0;
        do {
          if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar10 + -4)
              == '\x01') {
            uVar12 = *(undefined1 *)
                      ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar10 + -2);
          }
          else {
            uVar12 = 0;
          }
          *(undefined1 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar10 + -4)
               = uVar12;
          lVar10 = lVar10 + 0x84;
        } while (lVar10 != 0x2100);
      }
      if (local_c4 == 0) {
        if (local_d4 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
          lVar10 = 0;
          do {
            *(undefined4 *)(local_128 + lVar10 * 4) = 0xbf800000;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          local_f8.order = local_128._0_4_;
          local_f8.type = local_128._4_4_;
          uStack_f0 = local_128._8_8_;
          lVar10 = 0;
          do {
            *(undefined4 *)(local_128 + lVar10 * 4) = 0x3f800000;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
        }
        else if (local_d4 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
          local_f8.order = R;
          local_f8.type = SNORM_INT8;
          uStack_f0 = 0;
          lVar10 = 0;
          do {
            *(undefined4 *)(local_128 + lVar10 * 4) = 0x3f800000;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
        }
        else {
          lVar10 = 0;
          do {
            *(undefined4 *)(local_128 + lVar10 * 4) = 0xff800000;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          local_f8.order = local_128._0_4_;
          local_f8.type = local_128._4_4_;
          uStack_f0 = local_128._8_8_;
          lVar10 = 0;
          do {
            *(undefined4 *)(local_128 + lVar10 * 4) = 0x7f800000;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
        }
        local_108.order = local_128._0_4_;
        local_108.type = local_128._4_4_;
        uStack_100 = local_128._8_8_;
        if (state->blendMode == BLENDMODE_STANDARD) {
          uVar14 = 0;
          local_e8 = uVar21;
          do {
            pFVar7 = local_170;
            if (this->m_sampleRegister[uVar14].isAlive == true) {
              uVar21 = (ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff;
              iVar8 = (int)((long)uVar21 / (long)numSamplesPerFragment) + (int)uVar23;
              local_50 = local_170 + iVar8;
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_128,(int)local_148._24_8_,
                         (int)((long)uVar21 % (long)numSamplesPerFragment),
                         local_170[iVar8].pixelCoord.m_data[0]);
              local_168 = *(TextureFormat *)&pFVar7[iVar8].value.v;
              uStack_160 = *(undefined8 *)((long)&pFVar7[iVar8].value.v + 8);
              local_148._0_4_ = R;
              local_148._4_4_ = SNORM_INT8;
              local_148._8_4_ = 0;
              local_148._12_4_ = 0;
              lVar10 = 0;
              do {
                fVar27 = (float)(&local_168.order)[lVar10];
                fVar26 = *(float *)(local_128 + lVar10 * 4 + 0x20);
                if (fVar27 <= *(float *)(local_128 + lVar10 * 4 + 0x20)) {
                  fVar26 = fVar27;
                }
                uVar15 = -(uint)(fVar27 < (float)(&local_f8.order)[lVar10]);
                *(ChannelOrder *)(local_148 + lVar10 * 4) =
                     uVar15 & (&local_f8.order)[lVar10] | ~uVar15 & (uint)fVar26;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              *(undefined8 *)this->m_sampleRegister[uVar14].clampedBlendSrcColor.m_data =
                   local_148._0_8_;
              *(undefined8 *)(this->m_sampleRegister[uVar14].clampedBlendSrcColor.m_data + 2) =
                   local_148._8_8_;
              local_168 = *(TextureFormat *)&(local_50->value1).v;
              uStack_160 = *(ulong *)((long)&(local_50->value1).v + 8);
              local_148._0_4_ = R;
              local_148._4_4_ = SNORM_INT8;
              local_148._8_4_ = 0;
              local_148._12_4_ = 0;
              lVar10 = 0;
              do {
                fVar27 = (float)(&local_168.order)[lVar10];
                fVar26 = *(float *)(local_128 + lVar10 * 4 + 0x20);
                if (fVar27 <= *(float *)(local_128 + lVar10 * 4 + 0x20)) {
                  fVar26 = fVar27;
                }
                uVar15 = -(uint)(fVar27 < (float)(&local_f8.order)[lVar10]);
                *(ChannelOrder *)(local_148 + lVar10 * 4) =
                     uVar15 & (&local_f8.order)[lVar10] | ~uVar15 & (uint)fVar26;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              *(undefined8 *)this->m_sampleRegister[uVar14].clampedBlendSrc1Color.m_data =
                   local_148._0_8_;
              *(undefined8 *)(this->m_sampleRegister[uVar14].clampedBlendSrc1Color.m_data + 2) =
                   local_148._8_8_;
              if ((char)local_150 == '\0') {
                local_168.order = local_128._0_4_;
                local_168.type = local_128._4_4_;
                uStack_160 = local_128._8_8_;
              }
              else {
                tcu::sRGBToLinear((tcu *)&local_168,(Vec4 *)local_128);
              }
              uVar23 = (ulong)local_14c;
              local_148._0_4_ = R;
              local_148._4_4_ = SNORM_INT8;
              local_148._8_4_ = 0;
              local_148._12_4_ = 0;
              lVar10 = 0;
              do {
                fVar27 = (float)(&local_168.order)[lVar10];
                fVar26 = *(float *)(local_128 + lVar10 * 4 + 0x20);
                if (fVar27 <= *(float *)(local_128 + lVar10 * 4 + 0x20)) {
                  fVar26 = fVar27;
                }
                uVar15 = -(uint)(fVar27 < (float)(&local_f8.order)[lVar10]);
                *(ChannelOrder *)(local_148 + lVar10 * 4) =
                     uVar15 & (&local_f8.order)[lVar10] | ~uVar15 & (uint)fVar26;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              *(undefined8 *)this->m_sampleRegister[uVar14].clampedBlendDstColor.m_data =
                   local_148._0_8_;
              *(undefined8 *)(this->m_sampleRegister[uVar14].clampedBlendDstColor.m_data + 2) =
                   local_148._8_8_;
            }
            blendColor = local_78;
            blendRGBState = local_80;
            iVar16 = (int)uVar23;
            uVar14 = uVar14 + 1;
          } while (uVar14 != 0x40);
          executeBlendFactorComputeRGB(this,local_78,local_80);
          blendAState = local_88;
          executeBlendFactorComputeA(this,blendColor,local_88);
          executeBlend(this,blendRGBState,blendAState);
          uVar21 = local_e8;
          iVar8 = local_128._28_4_;
        }
        else if (state->blendMode == BLENDMODE_ADVANCED) {
          uVar14 = 0;
          local_e8 = uVar21;
          do {
            if (this->m_sampleRegister[uVar14].isAlive == true) {
              uVar21 = (ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff;
              iVar8 = (int)((long)uVar21 / (long)numSamplesPerFragment) + iVar16;
              local_128._0_8_ = *(undefined8 *)&local_170[iVar8].value.v;
              local_128._8_8_ = *(ulong *)((long)&local_170[iVar8].value.v + 8);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_148,(int)local_148._24_8_,
                         (int)((long)uVar21 % (long)numSamplesPerFragment),
                         local_170[iVar8].pixelCoord.m_data[0]);
              local_168.order = R;
              local_168.type = SNORM_INT8;
              uStack_160 = 0;
              lVar10 = 0;
              do {
                fVar27 = *(float *)(local_128 + lVar10 * 4);
                fVar26 = *(float *)(local_128 + lVar10 * 4 + 0x20);
                if (fVar27 <= *(float *)(local_128 + lVar10 * 4 + 0x20)) {
                  fVar26 = fVar27;
                }
                CVar25 = -(uint)(fVar27 < (float)(&local_f8.order)[lVar10]);
                (&local_168.order)[lVar10] =
                     CVar25 & (&local_f8.order)[lVar10] | ~CVar25 & (uint)fVar26;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              fVar29 = 0.0;
              fVar26 = 0.0;
              fVar28 = 0.0;
              fVar27 = 0.0;
              if (0.0 < uStack_160._4_4_) {
                fVar28 = (float)local_168.order / uStack_160._4_4_;
                fVar26 = (float)local_168.type / uStack_160._4_4_;
                fVar29 = (float)uStack_160 / uStack_160._4_4_;
                fVar27 = uStack_160._4_4_;
              }
              this->m_sampleRegister[uVar14].clampedBlendSrcColor.m_data[0] = fVar28;
              this->m_sampleRegister[uVar14].clampedBlendSrcColor.m_data[1] = fVar26;
              this->m_sampleRegister[uVar14].clampedBlendSrcColor.m_data[2] = fVar29;
              this->m_sampleRegister[uVar14].clampedBlendSrcColor.m_data[3] = fVar27;
              if ((char)local_150 == '\0') {
                local_48.order = local_148._0_4_;
                local_48.type = local_148._4_4_;
                aiStack_40[0] = local_148._8_4_;
                aiStack_40[1] = local_148._12_4_;
              }
              else {
                tcu::sRGBToLinear((tcu *)&local_48,(Vec4 *)local_148);
              }
              local_168.order = R;
              local_168.type = SNORM_INT8;
              uStack_160 = 0;
              lVar10 = 0;
              do {
                fVar27 = (float)(&local_48.order)[lVar10];
                fVar26 = *(float *)(local_128 + lVar10 * 4 + 0x20);
                if (fVar27 <= *(float *)(local_128 + lVar10 * 4 + 0x20)) {
                  fVar26 = fVar27;
                }
                CVar25 = -(uint)(fVar27 < (float)(&local_f8.order)[lVar10]);
                (&local_168.order)[lVar10] =
                     CVar25 & (&local_f8.order)[lVar10] | ~CVar25 & (uint)fVar26;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              fVar29 = 0.0;
              fVar26 = 0.0;
              fVar28 = 0.0;
              fVar27 = 0.0;
              if (0.0 < uStack_160._4_4_) {
                fVar28 = (float)local_168.order / uStack_160._4_4_;
                fVar26 = (float)local_168.type / uStack_160._4_4_;
                fVar29 = (float)uStack_160 / uStack_160._4_4_;
                fVar27 = uStack_160._4_4_;
              }
              this->m_sampleRegister[uVar14].clampedBlendDstColor.m_data[0] = fVar28;
              this->m_sampleRegister[uVar14].clampedBlendDstColor.m_data[1] = fVar26;
              this->m_sampleRegister[uVar14].clampedBlendDstColor.m_data[2] = fVar29;
              this->m_sampleRegister[uVar14].clampedBlendDstColor.m_data[3] = fVar27;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != 0x40);
          executeAdvancedBlend(this,state->blendEquationAdvaced);
          uVar21 = local_e8;
          iVar8 = local_128._28_4_;
        }
        else {
          uVar14 = 0;
          do {
            if (this->m_sampleRegister[uVar14].isAlive == true) {
              iVar9 = (int)((long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff)
                           / (long)numSamplesPerFragment) + iVar16;
              local_148._0_8_ = *(TextureFormat *)&local_170[iVar9].value.v;
              local_148._8_8_ = *(undefined8 *)((long)&local_170[iVar9].value.v + 8);
              local_128._0_8_ = local_148;
              local_128._8_8_ = 0x100000000;
              local_128._16_4_ = 2;
              local_168.order = R;
              local_168.type = SNORM_INT8;
              uStack_160 = uStack_160 & 0xffffffff00000000;
              lVar10 = 2;
              do {
                *(undefined4 *)((long)&local_170 + lVar10 * 4) =
                     *(undefined4 *)(local_148 + (long)*(int *)(local_128 + lVar10 * 4) * 4);
                lVar10 = lVar10 + 1;
              } while (lVar10 != 5);
              this->m_sampleRegister[uVar14].blendedRGB.m_data[2] = (float)uStack_160;
              this->m_sampleRegister[uVar14].blendedRGB.m_data[0] = (float)local_168.order;
              this->m_sampleRegister[uVar14].blendedRGB.m_data[1] = (float)local_168.type;
              this->m_sampleRegister[uVar14].blendedA = (float)local_170[iVar9].value.v.uData[3];
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != 0x40);
        }
        if (local_d4 != TEXTURECHANNELCLASS_FLOATING_POINT) {
          lVar10 = 0;
          pVVar11 = local_70;
          do {
            if (this->m_sampleRegister[lVar10].isAlive == true) {
              local_148._0_4_ = local_f8.order;
              local_148._4_4_ = local_f8.type;
              local_148._8_4_ = (int)uStack_f0;
              local_168 = local_108;
              uStack_160 = CONCAT44(uStack_160._4_4_,(undefined4)uStack_100);
              local_128._0_4_ = R;
              local_128._4_4_ = SNORM_INT8;
              local_128._8_8_ = local_128._8_8_ & 0xffffffff00000000;
              lVar20 = 0;
              do {
                fVar27 = pVVar11->m_data[lVar20];
                fVar26 = (float)(&local_168.order)[lVar20];
                if (fVar27 <= (float)(&local_168.order)[lVar20]) {
                  fVar26 = fVar27;
                }
                uVar15 = -(uint)(fVar27 < *(float *)(local_148 + lVar20 * 4));
                *(uint *)(local_128 + lVar20 * 4) =
                     uVar15 & (uint)*(float *)(local_148 + lVar20 * 4) | ~uVar15 & (uint)fVar26;
                lVar20 = lVar20 + 1;
              } while (lVar20 != 3);
              this->m_sampleRegister[lVar10].blendedRGB.m_data[2] = (float)local_128._8_4_;
              *(undefined8 *)this->m_sampleRegister[lVar10].blendedRGB.m_data = local_128._0_8_;
              fVar27 = this->m_sampleRegister[lVar10].blendedA;
              fVar26 = uStack_100._4_4_;
              if (fVar27 <= uStack_100._4_4_) {
                fVar26 = fVar27;
              }
              this->m_sampleRegister[lVar10].blendedA =
                   (float)(-(uint)(fVar27 < uStack_f0._4_4_) & (uint)uStack_f0._4_4_ |
                          ~-(uint)(fVar27 < uStack_f0._4_4_) & (uint)fVar26);
            }
            lVar10 = lVar10 + 1;
            pVVar11 = pVVar11 + 0xb;
          } while (lVar10 != 0x40);
        }
        if (local_e0->m_data[0] == true) {
          if ((((state->colorMask).m_data[1] == true) && ((state->colorMask).m_data[2] == true)) &&
             ((state->colorMask).m_data[3] == true)) {
            if (((((PixelBufferAccess *)local_148._24_8_)->super_ConstPixelBufferAccess).m_format.
                 order == RGBA) &&
               ((((PixelBufferAccess *)local_148._24_8_)->super_ConstPixelBufferAccess).m_format.
                type == UNORM_INT8)) {
              executeRGBA8ColorWrite
                        (this,iVar16,numSamplesPerFragment,local_170,
                         (PixelBufferAccess *)local_148._24_8_);
            }
            else {
              executeColorWrite(this,iVar16,numSamplesPerFragment,local_170,(bool)(char)local_150,
                                (PixelBufferAccess *)local_148._24_8_);
            }
          }
          else {
LAB_008dfc5f:
            executeMaskedColorWrite
                      (this,iVar16,numSamplesPerFragment,local_170,&local_98,&local_a8,
                       (bool)(char)local_150,(PixelBufferAccess *)local_148._24_8_);
          }
        }
        else if ((((state->colorMask).m_data[1] != false) || ((state->colorMask).m_data[2] != false)
                 ) || ((state->colorMask).m_data[3] == true)) goto LAB_008dfc5f;
      }
      else if (local_c4 == 2) {
        uVar14 = 0;
        piVar17 = local_68;
        do {
          if (*(char *)(piVar17 + -0x1c) == '\x01') {
            pGVar1 = &local_170[(int)((long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 |
                                            uVar14 & 0xffffffff) / (long)numSamplesPerFragment) +
                                iVar16].value;
            dVar4 = (pGVar1->v).uData[1];
            dVar5 = (pGVar1->v).uData[2];
            dVar6 = (pGVar1->v).uData[3];
            ((Vector<int,_4> *)(piVar17 + -3))->m_data[0] = (pGVar1->v).uData[0];
            piVar17[-2] = dVar4;
            piVar17[-1] = dVar5;
            *piVar17 = dVar6;
          }
          uVar14 = uVar14 + 1;
          piVar17 = piVar17 + 0x21;
        } while (uVar14 != 0x40);
        if (((local_e0->m_data[0] != false) || ((state->colorMask).m_data[1] != false)) ||
           (((state->colorMask).m_data[2] != false || ((state->colorMask).m_data[3] == true)))) {
          executeSignedValueWrite
                    (this,iVar16,numSamplesPerFragment,local_170,local_e0,
                     (PixelBufferAccess *)local_148._24_8_);
        }
      }
      else {
        uVar14 = 0;
        puVar18 = local_60;
        do {
          if (*(char *)(puVar18 + -0x20) == '\x01') {
            pGVar1 = &local_170[(int)((long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 |
                                            uVar14 & 0xffffffff) / (long)numSamplesPerFragment) +
                                iVar16].value;
            uVar15 = (pGVar1->v).uData[1];
            uVar22 = (pGVar1->v).uData[2];
            uVar3 = (pGVar1->v).uData[3];
            ((Vector<unsigned_int,_4> *)(puVar18 + -3))->m_data[0] = (pGVar1->v).uData[0];
            puVar18[-2] = uVar15;
            puVar18[-1] = uVar22;
            *puVar18 = uVar3;
          }
          uVar14 = uVar14 + 1;
          puVar18 = puVar18 + 0x21;
        } while (uVar14 != 0x40);
        if ((((local_e0->m_data[0] != false) || ((state->colorMask).m_data[1] != false)) ||
            ((state->colorMask).m_data[2] != false)) || ((state->colorMask).m_data[3] == true)) {
          executeUnsignedValueWrite
                    (this,iVar16,numSamplesPerFragment,local_170,local_e0,
                     (PixelBufferAccess *)local_148._24_8_);
        }
      }
      iVar16 = (int)uVar21;
      uVar21 = (ulong)(iVar16 + 1);
    } while (iVar16 != (int)local_d0);
  }
  return;
}

Assistant:

void FragmentProcessor::render (const rr::MultisamplePixelBufferAccess&		msColorBuffer,
								const rr::MultisamplePixelBufferAccess&		msDepthBuffer,
								const rr::MultisamplePixelBufferAccess&		msStencilBuffer,
								const Fragment*								inputFragments,
								int											numFragments,
								FaceType									fragmentFacing,
								const FragmentOperationState&				state)
{
	DE_ASSERT(fragmentFacing < FACETYPE_LAST);
	DE_ASSERT(state.numStencilBits < 32); // code bitshifts numStencilBits, avoid undefined behavior

	const tcu::PixelBufferAccess&	colorBuffer			= msColorBuffer.raw();
	const tcu::PixelBufferAccess&	depthBuffer			= msDepthBuffer.raw();
	const tcu::PixelBufferAccess&	stencilBuffer		= msStencilBuffer.raw();

	bool							hasDepth			= depthBuffer.getWidth() > 0	&& depthBuffer.getHeight() > 0		&& depthBuffer.getDepth() > 0;
	bool							hasStencil			= stencilBuffer.getWidth() > 0	&& stencilBuffer.getHeight() > 0	&& stencilBuffer.getDepth() > 0;
	bool							doDepthTest			= hasDepth && state.depthTestEnabled;
	bool							doStencilTest		= hasStencil && state.stencilTestEnabled;

	tcu::TextureChannelClass		colorbufferClass	= tcu::getTextureChannelClass(msColorBuffer.raw().getFormat().type);
	rr::GenericVecType				fragmentDataType	= (colorbufferClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER) ? (rr::GENERICVECTYPE_INT32) : ((colorbufferClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER) ? (rr::GENERICVECTYPE_UINT32) : (rr::GENERICVECTYPE_FLOAT));

	DE_ASSERT((!hasDepth || colorBuffer.getWidth() == depthBuffer.getWidth())	&& (!hasStencil || colorBuffer.getWidth() == stencilBuffer.getWidth()));
	DE_ASSERT((!hasDepth || colorBuffer.getHeight() == depthBuffer.getHeight())	&& (!hasStencil || colorBuffer.getHeight() == stencilBuffer.getHeight()));
	DE_ASSERT((!hasDepth || colorBuffer.getDepth() == depthBuffer.getDepth())	&& (!hasStencil || colorBuffer.getDepth() == stencilBuffer.getDepth()));

	// Combined formats must be separated beforehand
	DE_ASSERT(!hasDepth || (!tcu::isCombinedDepthStencilType(depthBuffer.getFormat().type) && depthBuffer.getFormat().order == tcu::TextureFormat::D));
	DE_ASSERT(!hasStencil || (!tcu::isCombinedDepthStencilType(stencilBuffer.getFormat().type) && stencilBuffer.getFormat().order == tcu::TextureFormat::S));

	int						numSamplesPerFragment		= colorBuffer.getWidth();
	int						totalNumSamples				= numFragments*numSamplesPerFragment;
	int						numSampleGroups				= (totalNumSamples - 1) / SAMPLE_REGISTER_SIZE + 1; // \note totalNumSamples/SAMPLE_REGISTER_SIZE rounded up.
	const StencilState&		stencilState				= state.stencilStates[fragmentFacing];
	Vec4					colorMaskFactor				(state.colorMask[0] ? 1.0f : 0.0f, state.colorMask[1] ? 1.0f : 0.0f, state.colorMask[2] ? 1.0f : 0.0f, state.colorMask[3] ? 1.0f : 0.0f);
	Vec4					colorMaskNegationFactor		(state.colorMask[0] ? 0.0f : 1.0f, state.colorMask[1] ? 0.0f : 1.0f, state.colorMask[2] ? 0.0f : 1.0f, state.colorMask[3] ? 0.0f : 1.0f);
	bool					sRGBTarget					= state.sRGBEnabled && tcu::isSRGB(colorBuffer.getFormat());

	DE_ASSERT(SAMPLE_REGISTER_SIZE % numSamplesPerFragment == 0);

	// Divide the fragments' samples into groups of size SAMPLE_REGISTER_SIZE, and perform
	// the per-sample operations for one group at a time.

	for (int sampleGroupNdx = 0; sampleGroupNdx < numSampleGroups; sampleGroupNdx++)
	{
		// The index of the fragment of the sample at the beginning of m_sampleRegisters.
		int groupFirstFragNdx = (sampleGroupNdx*SAMPLE_REGISTER_SIZE) / numSamplesPerFragment;

		// Initialize sample data in the sample register.

		for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
		{
			int fragNdx			= groupFirstFragNdx + regSampleNdx/numSamplesPerFragment;
			int fragSampleNdx	= regSampleNdx % numSamplesPerFragment;

			if (fragNdx < numFragments)
			{
				m_sampleRegister[regSampleNdx].isAlive		= (inputFragments[fragNdx].coverage & (1u << fragSampleNdx)) != 0;
				m_sampleRegister[regSampleNdx].depthPassed	= true; // \note This will stay true if depth test is disabled.
			}
			else
				m_sampleRegister[regSampleNdx].isAlive = false;
		}

		// Scissor test.

		if (state.scissorTestEnabled)
			executeScissorTest(groupFirstFragNdx, numSamplesPerFragment, inputFragments, state.scissorRectangle);

		// Stencil test.

		if (doStencilTest)
		{
			executeStencilCompare(groupFirstFragNdx, numSamplesPerFragment, inputFragments, stencilState, state.numStencilBits, stencilBuffer);
			executeStencilSFail(groupFirstFragNdx, numSamplesPerFragment, inputFragments, stencilState, state.numStencilBits, stencilBuffer);
		}

		// Depth test.
		// \note Current value of isAlive is needed for dpPass and dpFail, so it's only updated after them and not right after depth test.

		if (doDepthTest)
		{
			executeDepthCompare(groupFirstFragNdx, numSamplesPerFragment, inputFragments, state.depthFunc, depthBuffer);

			if (state.depthMask)
				executeDepthWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, depthBuffer);
		}

		// Do dpFail and dpPass stencil writes.

		if (doStencilTest)
			executeStencilDpFailAndPass(groupFirstFragNdx, numSamplesPerFragment, inputFragments, stencilState, state.numStencilBits, stencilBuffer);

		// Kill the samples that failed depth test.

		if (doDepthTest)
		{
			for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
				m_sampleRegister[regSampleNdx].isAlive = m_sampleRegister[regSampleNdx].isAlive && m_sampleRegister[regSampleNdx].depthPassed;
		}

		// Paint fragments to target

		switch (fragmentDataType)
		{
			case rr::GENERICVECTYPE_FLOAT:
			{
				// Select min/max clamping values for blending factors and operands
				Vec4 minClampValue;
				Vec4 maxClampValue;

				if (colorbufferClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
				{
					minClampValue = Vec4(0.0f);
					maxClampValue = Vec4(1.0f);
				}
				else if (colorbufferClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT)
				{
					minClampValue = Vec4(-1.0f);
					maxClampValue = Vec4(1.0f);
				}
				else
				{
					// No clamping
					minClampValue = Vec4(-std::numeric_limits<float>::infinity());
					maxClampValue = Vec4(std::numeric_limits<float>::infinity());
				}

				// Blend calculation - only if using blend.
				if (state.blendMode == BLENDMODE_STANDARD)
				{
					// Put dst color to register, doing srgb-to-linear conversion if needed.
					for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
					{
						if (m_sampleRegister[regSampleNdx].isAlive)
						{
							int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
							const Fragment&		frag			= inputFragments[groupFirstFragNdx + regSampleNdx/numSamplesPerFragment];
							Vec4				dstColor		= colorBuffer.getPixel(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());

							m_sampleRegister[regSampleNdx].clampedBlendSrcColor		= clamp(frag.value.get<float>(), minClampValue, maxClampValue);
							m_sampleRegister[regSampleNdx].clampedBlendSrc1Color	= clamp(frag.value1.get<float>(), minClampValue, maxClampValue);
							m_sampleRegister[regSampleNdx].clampedBlendDstColor		= clamp(sRGBTarget ? tcu::sRGBToLinear(dstColor) : dstColor, minClampValue, maxClampValue);
						}
					}

					// Calculate blend factors to register.
					executeBlendFactorComputeRGB(state.blendColor, state.blendRGBState);
					executeBlendFactorComputeA(state.blendColor, state.blendAState);

					// Compute blended color.
					executeBlend(state.blendRGBState, state.blendAState);
				}
				else if (state.blendMode == BLENDMODE_ADVANCED)
				{
					// Unpremultiply colors for blending, and do sRGB->linear if necessary
					// \todo [2014-03-17 pyry] Re-consider clampedBlend*Color var names
					for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
					{
						if (m_sampleRegister[regSampleNdx].isAlive)
						{
							int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
							const Fragment&		frag			= inputFragments[groupFirstFragNdx + regSampleNdx/numSamplesPerFragment];
							const Vec4			srcColor		= frag.value.get<float>();
							const Vec4			dstColor		= colorBuffer.getPixel(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());

							m_sampleRegister[regSampleNdx].clampedBlendSrcColor		= unpremultiply(clamp(srcColor, minClampValue, maxClampValue));
							m_sampleRegister[regSampleNdx].clampedBlendDstColor		= unpremultiply(clamp(sRGBTarget ? tcu::sRGBToLinear(dstColor) : dstColor, minClampValue, maxClampValue));
						}
					}

					executeAdvancedBlend(state.blendEquationAdvaced);
				}
				else
				{
					// Not using blend - just put values to register as-is.
					DE_ASSERT(state.blendMode == BLENDMODE_NONE);

					for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
					{
						if (m_sampleRegister[regSampleNdx].isAlive)
						{
							const Fragment& frag = inputFragments[groupFirstFragNdx + regSampleNdx/numSamplesPerFragment];

							m_sampleRegister[regSampleNdx].blendedRGB	= frag.value.get<float>().xyz();
							m_sampleRegister[regSampleNdx].blendedA		= frag.value.get<float>().w();
						}
					}
				}

				// Clamp result values in sample register
				if (colorbufferClass != tcu::TEXTURECHANNELCLASS_FLOATING_POINT)
				{
					for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
					{
						if (m_sampleRegister[regSampleNdx].isAlive)
						{
							m_sampleRegister[regSampleNdx].blendedRGB	= clamp(m_sampleRegister[regSampleNdx].blendedRGB, minClampValue.swizzle(0, 1, 2), maxClampValue.swizzle(0, 1, 2));
							m_sampleRegister[regSampleNdx].blendedA		= clamp(m_sampleRegister[regSampleNdx].blendedA, minClampValue.w(), maxClampValue.w());
						}
					}
				}

				// Finally, write the colors to the color buffer.

				if (state.colorMask[0] && state.colorMask[1] && state.colorMask[2] && state.colorMask[3])
				{
					if (colorBuffer.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8))
						executeRGBA8ColorWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, colorBuffer);
					else
						executeColorWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, sRGBTarget, colorBuffer);
				}
				else if (state.colorMask[0] || state.colorMask[1] || state.colorMask[2] || state.colorMask[3])
					executeMaskedColorWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, colorMaskFactor, colorMaskNegationFactor, sRGBTarget, colorBuffer);
				break;
			}
			case rr::GENERICVECTYPE_INT32:
				// Write fragments
				for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
				{
					if (m_sampleRegister[regSampleNdx].isAlive)
					{
						const Fragment& frag = inputFragments[groupFirstFragNdx + regSampleNdx/numSamplesPerFragment];

						m_sampleRegister[regSampleNdx].signedValue = frag.value.get<deInt32>();
					}
				}

				if (state.colorMask[0] || state.colorMask[1] || state.colorMask[2] || state.colorMask[3])
					executeSignedValueWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, state.colorMask, colorBuffer);
				break;

			case rr::GENERICVECTYPE_UINT32:
				// Write fragments
				for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
				{
					if (m_sampleRegister[regSampleNdx].isAlive)
					{
						const Fragment& frag = inputFragments[groupFirstFragNdx + regSampleNdx/numSamplesPerFragment];

						m_sampleRegister[regSampleNdx].unsignedValue = frag.value.get<deUint32>();
					}
				}

				if (state.colorMask[0] || state.colorMask[1] || state.colorMask[2] || state.colorMask[3])
					executeUnsignedValueWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, state.colorMask, colorBuffer);
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}